

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase * EvaluateReturn(ExpressionEvalContext *ctx,ExprReturn *expression)

{
  StackFrame *pSVar1;
  bool bVar2;
  StackFrame **ppSVar3;
  ExprBase *pEVar4;
  ExprBase *value;
  StackFrame *frame;
  ExprReturn *expression_local;
  ExpressionEvalContext *ctx_local;
  
  bVar2 = AddInstruction(ctx);
  if (bVar2) {
    ppSVar3 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames);
    pSVar1 = *ppSVar3;
    if (pSVar1->targetYield == 0) {
      pEVar4 = Evaluate(ctx,expression->value);
      if (pEVar4 == (ExprBase *)0x0) {
        ctx_local = (ExpressionEvalContext *)0x0;
      }
      else {
        bVar2 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::empty(&ctx->stackFrames);
        if (bVar2) {
          ctx_local = (ExpressionEvalContext *)Report(ctx,"ERROR: no stack frame to return from");
        }
        else {
          pSVar1->returnValue = pEVar4;
          if ((expression->coroutineStateUpdate == (ExprBase *)0x0) ||
             (pEVar4 = Evaluate(ctx,expression->coroutineStateUpdate), pEVar4 != (ExprBase *)0x0)) {
            if ((expression->closures == (ExprBase *)0x0) ||
               (pEVar4 = Evaluate(ctx,expression->closures), pEVar4 != (ExprBase *)0x0)) {
              pEVar4 = &ExpressionContext::get<ExprVoid>(ctx->ctx)->super_ExprBase;
              ExprVoid::ExprVoid((ExprVoid *)pEVar4,(expression->super_ExprBase).source,
                                 ctx->ctx->typeVoid);
              ctx_local = (ExpressionEvalContext *)CheckType(&expression->super_ExprBase,pEVar4);
            }
            else {
              ctx_local = (ExpressionEvalContext *)0x0;
            }
          }
          else {
            ctx_local = (ExpressionEvalContext *)0x0;
          }
        }
      }
    }
    else {
      pEVar4 = &ExpressionContext::get<ExprVoid>(ctx->ctx)->super_ExprBase;
      ExprVoid::ExprVoid((ExprVoid *)pEVar4,(expression->super_ExprBase).source,ctx->ctx->typeVoid);
      ctx_local = (ExpressionEvalContext *)CheckType(&expression->super_ExprBase,pEVar4);
    }
  }
  else {
    ctx_local = (ExpressionEvalContext *)0x0;
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* EvaluateReturn(ExpressionEvalContext &ctx, ExprReturn *expression)
{
	if(!AddInstruction(ctx))
		return NULL;

	ExpressionEvalContext::StackFrame *frame = ctx.stackFrames.back();

	if(frame->targetYield)
		return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));

	ExprBase *value = Evaluate(ctx, expression->value);

	if(!value)
		return NULL;

	if(ctx.stackFrames.empty())
		return Report(ctx, "ERROR: no stack frame to return from");

	frame->returnValue = value;

	if(expression->coroutineStateUpdate)
	{
		if(!Evaluate(ctx, expression->coroutineStateUpdate))
			return NULL;
	}

	if(expression->closures)
	{
		if(!Evaluate(ctx, expression->closures))
			return NULL;
	}

	return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
}